

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.c
# Opt level: O3

uint key_derivation(uchar *plaintext,int plaintext_len,uchar *key,int key_len,uchar *digest)

{
  undefined8 in_RAX;
  HMAC_CTX *ctx;
  EVP_MD *md;
  uint len;
  uint local_34;
  
  local_34 = (uint)((ulong)in_RAX >> 0x20);
  ctx = (HMAC_CTX *)HMAC_CTX_new();
  md = EVP_md5();
  HMAC_Init_ex(ctx,key,key_len,md,(ENGINE *)0x0);
  HMAC_Update(ctx,plaintext,(long)plaintext_len);
  HMAC_Final(ctx,digest,&local_34);
  HMAC_CTX_free(ctx);
  return local_34;
}

Assistant:

unsigned int key_derivation(unsigned char *plaintext, int plaintext_len,
                            unsigned char *key, int key_len,
                            unsigned char *digest) {
    HMAC_CTX *ctx;

    unsigned int len;

    /* Create and initialise the context */
    ctx = HMAC_CTX_new();

    /* Initialise the decryption operation. */
    HMAC_Init_ex(ctx, key, key_len, EVP_md5(), NULL);

    /* compute the digest */
    HMAC_Update(ctx, plaintext, plaintext_len);

    /* Finalise the digest */
    HMAC_Final(ctx, digest, &len);

    /* Clean up */
    HMAC_CTX_free(ctx);

    return len;
}